

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O2

cio_error cio_uart_set_parity(cio_uart *port,cio_uart_parity parity)

{
  cio_error cVar1;
  termios tty;
  termios local_4c;
  
  if (port != (cio_uart *)0x0) {
    cVar1 = get_current_settings(port,&local_4c);
    if (cVar1 == CIO_SUCCESS) {
      switch(parity) {
      case CIO_UART_PARITY_EVEN:
        local_4c.c_cflag = local_4c.c_cflag & 0xbffffcff | 0x100;
        break;
      case CIO_UART_PARITY_ODD:
        local_4c.c_cflag = local_4c.c_cflag & 0xbffffcff | 0x300;
        break;
      case CIO_UART_PARITY_NONE:
        local_4c.c_cflag = local_4c.c_cflag & 0xbffffeff;
        break;
      case CIO_UART_PARITY_MARK:
        local_4c.c_cflag = local_4c.c_cflag | 0x40000300;
        break;
      case CIO_UART_PARITY_SPACE:
        local_4c.c_cflag = local_4c.c_cflag & 0xbffffcff | 0x40000100;
        break;
      default:
        return CIO_INVALID_ARGUMENT;
      }
      cVar1 = set_termios((port->impl).ev.fd,&local_4c);
    }
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

enum cio_error cio_uart_set_parity(const struct cio_uart *port, enum cio_uart_parity parity)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (parity) {
	case CIO_UART_PARITY_NONE:
		tty.c_cflag &= ~(tcflag_t)CMSPAR;
		tty.c_cflag &= ~(tcflag_t)PARENB;
		break;
	case CIO_UART_PARITY_ODD:
		tty.c_cflag &= ~(tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag |= (tcflag_t)PARODD;
		break;
	case CIO_UART_PARITY_EVEN:
		tty.c_cflag &= ~(tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag &= ~(tcflag_t)PARODD;
		break;
	case CIO_UART_PARITY_MARK:
		tty.c_cflag |= (tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag |= (tcflag_t)PARODD;
		break;
	case CIO_UART_PARITY_SPACE:
		tty.c_cflag |= (tcflag_t)CMSPAR;
		tty.c_cflag |= (tcflag_t)PARENB;
		tty.c_cflag &= ~(tcflag_t)PARODD;
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}